

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O2

uint32_t * __thiscall
FastPForLib::CompositeCodec<FastPForLib::SIMDFastPFor<8U>,_FastPForLib::VariableByte>::
_decodeArray<unsigned_int>
          (CompositeCodec<FastPForLib::SIMDFastPFor<8U>,_FastPForLib::VariableByte> *this,
          uint32_t *in,size_t length,uint *out,size_t *nvalue)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  logic_error *this_00;
  size_t sVar3;
  size_t mynvalue1;
  size_t nvalue2;
  
  mynvalue1 = *nvalue;
  if (mynvalue1 == 0) {
    return in;
  }
  puVar2 = SIMDFastPFor<8U>::decodeArray(&this->codec1,in,length,out,&mynvalue1);
  puVar1 = in + length;
  if (puVar2 < puVar1) {
    sVar3 = *nvalue - mynvalue1;
    if (*nvalue < mynvalue1 || sVar3 == 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"Buffer contains more data than requested!");
    }
    else {
      nvalue2 = sVar3;
      puVar2 = VariableByte::decodeArray
                         (&this->codec2,puVar2,length - ((long)puVar2 - (long)in >> 2),
                          out + mynvalue1,&nvalue2);
      *nvalue = nvalue2 + mynvalue1;
      if (puVar2 <= puVar1) {
        return puVar2;
      }
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (this_00,"Decode run over output buffer. Potential buffer overflow!");
    }
  }
  else {
    *nvalue = mynvalue1;
    if (puVar2 <= puVar1) {
      return puVar2;
    }
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"Decode run over output buffer. Potential buffer overflow!");
  }
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

const uint32_t *_decodeArray(const uint32_t *in, const size_t length,
                               IntType *out, size_t &nvalue) {
    if (nvalue == 0) {
      return in;
    }
    const uint32_t *const initin(in);
    size_t mynvalue1 = nvalue;
    const uint32_t *in2 = codec1.decodeArray(in, length, out, mynvalue1);
    if (length + in > in2) {
      if (nvalue <= mynvalue1) {
        throw std::logic_error("Buffer contains more data than requested!");
      }
      size_t nvalue2 = nvalue - mynvalue1;
      const uint32_t *in3 = codec2.decodeArray(in2, length - (in2 - in),
                                               out + mynvalue1, nvalue2);
      nvalue = mynvalue1 + nvalue2;
      if (initin + length < in3) {
        throw std::logic_error(
            "Decode run over output buffer. Potential buffer overflow!");
      }
      return in3;
    }
    nvalue = mynvalue1;
    if (initin + length < in2) {
      throw std::logic_error(
          "Decode run over output buffer. Potential buffer overflow!");
    }
    return in2;
  }